

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-object.c
# Opt level: O3

void pdf_array_push(hd_context *ctx,pdf_obj *obj,pdf_obj *item)

{
  int iVar1;
  char *pcVar2;
  pdf_obj *val;
  
  if (((pdf_obj *)0x188 < obj) && (obj->kind == 'r')) {
    obj = pdf_resolve_indirect_chain(ctx,obj);
  }
  if (((pdf_obj_array *)0x188 < obj) && ((((pdf_obj_array *)obj)->super).kind == 'a')) {
    val = (pdf_obj *)0x188;
    if (item != (pdf_obj *)0x0) {
      val = item;
    }
    prepare_object_for_alteration(ctx,obj,val);
    if (((pdf_obj_array *)obj)->cap <= ((pdf_obj_array *)obj)->len) {
      pdf_array_grow(ctx,(pdf_obj_array *)obj);
    }
    if (((pdf_obj *)0x188 < val) && (0 < val->refs)) {
      val->refs = val->refs + 1;
    }
    iVar1 = ((pdf_obj_array *)obj)->len;
    ((pdf_obj_array *)obj)->items[iVar1] = val;
    ((pdf_obj_array *)obj)->len = iVar1 + 1;
    return;
  }
  pcVar2 = pdf_objkindstr(obj);
  hd_throw(ctx,2,"not an array (%s)",pcVar2);
}

Assistant:

void
pdf_array_push(hd_context *ctx, pdf_obj *obj, pdf_obj *item)
{
    RESOLVE(obj);
    if (!OBJ_IS_ARRAY(obj))
        hd_throw(ctx, HD_ERROR_GENERIC, "not an array (%s)", pdf_objkindstr(obj));

    if (!item)
        item = PDF_OBJ_NULL;

    prepare_object_for_alteration(ctx, obj, item);
    if (ARRAY(obj)->len + 1 > ARRAY(obj)->cap)
        pdf_array_grow(ctx, ARRAY(obj));
    ARRAY(obj)->items[ARRAY(obj)->len] = pdf_keep_obj(ctx, item);
    ARRAY(obj)->len++;
}